

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<16384U,_unsigned_int,_allocator<unsigned_int>_>_>
* __thiscall
math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::operator<<=
          (uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false> *this,int n)

{
  bool bVar1;
  uint n_00;
  iterator first;
  iterator last;
  int n_local;
  uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this_local;
  
  if (n < 0) {
    n_00 = detail::negate<int>(n);
    operator>>=(this,n_00);
  }
  else if (0 < n) {
    bVar1 = uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
            exceeds_width<int>(n);
    if (bVar1) {
      first = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
              begin((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                    this);
      last = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::end
                       ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                         *)this);
      detail::fill_unsafe<unsigned_int*,unsigned_int>(first,last,0);
    }
    else {
      uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::shl<int>
                ((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)this,n);
    }
  }
  return (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<16384U,_unsigned_int,_allocator<unsigned_int>_>_>
          *)this;
}

Assistant:

constexpr auto operator<<=(const SignedIntegralType n) -> std::enable_if_t<(   std::is_integral<SignedIntegralType>::value
                                                                                && std::is_signed  <SignedIntegralType>::value), uintwide_t>&
    {
      // Implement left-shift operator for signed integral argument.
      if(n < static_cast<SignedIntegralType>(0))
      {
        using local_unsigned_type =
          typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<SignedIntegralType>::digits + 1)>::exact_unsigned_type;

        operator>>=(static_cast<local_unsigned_type>(detail::negate(n)));
      }
      else if(n > static_cast<SignedIntegralType>(0))
      {
        if(exceeds_width(n))
        {
          // Exclude this line from code coverage, even though explicit
          // test cases (search for "result_overshift_is_ok") are known
          // to cover this line.
          detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
        else
        {
          shl(n);
        }
      }

      return *this;
    }